

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::uploadImageAspect
          (CopiesAndBlittingTestInstance *this,ConstPixelBufferAccess *imageAccess,VkImage *image,
          ImageParms *parms)

{
  Move<vk::VkCommandBuffer_s_*> *cmdBuffer;
  deUint32 dVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  CopiesAndBlittingTestInstance *this_00;
  ConstPixelBufferAccess *pCVar2;
  deUint32 dVar3;
  VkResult VVar4;
  VkImageAspectFlags VVar5;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar6;
  ulong uVar7;
  TextureFormat format;
  VkBufferCreateInfo *pVVar8;
  deUint32 dVar9;
  bool bVar10;
  undefined4 uVar11;
  deUint32 queueFamilyIndex;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_1a8;
  deUint64 local_188;
  undefined8 local_180;
  ulong local_178;
  VkQueue local_168;
  undefined8 local_160;
  CopiesAndBlittingTestInstance *local_158;
  ConstPixelBufferAccess *local_150;
  undefined1 local_148 [16];
  undefined8 local_138;
  VkAllocationCallbacks *pVStack_130;
  undefined8 local_128;
  deUint64 local_120;
  VkImageAspectFlags local_118;
  undefined8 local_114;
  undefined4 local_10c;
  deUint32 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  VkImageAspectFlags local_f0;
  undefined8 local_ec;
  deUint32 local_e4;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined8 local_d4;
  deUint32 local_cc;
  VkBufferCreateInfo bufferParams;
  undefined1 local_80 [40];
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_168 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_158 = this;
  pAVar6 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_150 = imageAccess;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_80,imageAccess);
  dVar3 = calculateSize((CopiesAndBlittingTestInstance *)local_80,imageAccess);
  bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  bVar10 = parms->imageType == VK_IMAGE_TYPE_2D;
  dVar1 = (parms->extent).depth;
  dVar9 = 1;
  if (bVar10) {
    dVar9 = dVar1;
  }
  local_160._0_4_ = (parms->extent).width;
  local_160._4_4_ = (parms->extent).height;
  if (bVar10) {
    dVar1 = 1;
  }
  bufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferParams.pNext = (void *)0x0;
  bufferParams._16_8_ = (ulong)(uint)bufferParams._20_4_ << 0x20;
  uVar7 = (ulong)dVar3;
  bufferParams.usage = 1;
  bufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferParams.queueFamilyIndexCount = 1;
  bufferParams.pQueueFamilyIndices = &queueFamilyIndex;
  bufferParams.size = uVar7;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_1a8,vk,device,&bufferParams,
                     (VkAllocationCallbacks *)0x0);
  local_138 = local_1a8.m_data.deleter.m_device;
  pVStack_130 = local_1a8.m_data.deleter.m_allocator;
  local_148._0_8_ = local_1a8.m_data.object.m_internal;
  local_148._8_8_ = local_1a8.m_data.deleter.m_deviceIface;
  local_1a8.m_data.object.m_internal = 0;
  local_1a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = local_138;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator = pVStack_130;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = local_148._0_8_;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_148._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_1a8);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)local_148,vk,device,
             (VkBuffer)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
            );
  (*pAVar6->_vptr_Allocator[3])(&local_1a8,pAVar6,local_148,1);
  local_1a8.m_data.object.m_internal = 0;
  data._8_4_ = dVar1;
  data.ptr = (Allocation *)device;
  data._12_4_ = queueFamilyIndex;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data
            );
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_1a8);
  VVar4 = (*vk->_vptr_DeviceInterface[0xc])
                    (vk,device,
                     buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                     ((bufferAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal,
                     (bufferAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     ptr)->m_offset);
  pCVar2 = local_150;
  ::vk::checkResult(VVar4,
                    "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x16c);
  local_1a8.m_data.object.m_internal._0_4_ = 0x2c;
  local_1a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1a8.m_data.deleter.m_device = (VkDevice)0x80000004000;
  local_1a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0xffffffffffffffff;
  local_188 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_180 = 0;
  local_178 = uVar7;
  format = ::vk::mapVkFormat(parms->format);
  local_118 = getAspectFlags(format);
  if (local_118 == 6) {
    VVar5 = getAspectFlags(pCVar2->m_format);
    bVar10 = VVar5 == 4;
  }
  else {
    bVar10 = false;
  }
  bufferParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferParams.pNext = (void *)0x0;
  bufferParams.flags = 0;
  bufferParams._20_4_ = 0x1000;
  bufferParams.size = 0x700000000;
  bufferParams.usage = 0xffffffff;
  bufferParams.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  local_120 = image->m_internal;
  bufferParams.pQueueFamilyIndices._4_4_ = 0;
  local_148._0_4_ = 0x2d;
  local_148._8_8_ = 0;
  local_138._0_4_ = 0x1000;
  local_138._4_4_ = 0x1000;
  pVStack_130 = (VkAllocationCallbacks *)0x700000007;
  local_128 = 0xffffffffffffffff;
  local_114 = 0x100000000;
  local_10c = 0;
  local_100 = 0;
  local_f8 = *(undefined8 *)(pCVar2->m_size).m_data;
  local_108 = dVar9;
  bufferParams._40_8_ = local_120;
  bufferParams.pQueueFamilyIndices._0_4_ = local_118;
  local_f0 = getAspectFlags(pCVar2->m_format);
  local_ec = 0;
  local_e0 = 0;
  local_d8 = 0;
  local_d4 = local_160;
  local_e4 = dVar9;
  local_cc = dVar1;
  memcpy((bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
         ptr)->m_hostPtr,pCVar2->m_data,uVar7);
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
               m_data.ptr)->m_memory).m_internal,
             (bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr)->m_offset,uVar7);
  this_00 = local_158;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext._0_4_ = 0;
  cmdBufferBeginInfo.pNext._4_4_ = 0;
  VVar4 = (*vk->_vptr_DeviceInterface[0x49])
                    (vk,(local_158->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                        object);
  ::vk::checkResult(VVar4,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x1c4);
  cmdBuffer = &this_00->m_cmdBuffer;
  pVVar8 = &bufferParams;
  if (bVar10 != false) {
    pVVar8 = (VkBufferCreateInfo *)0x0;
  }
  uVar7 = 0;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x4000,0x1000,0,0,
             0,1,&local_1a8,(ulong)(bVar10 ^ 1),pVVar8);
  uVar11 = 0;
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,
             buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             image->m_internal,7,1,&local_100);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x1000,1,0,0,0,
             uVar7 & 0xffffffff00000000,0,CONCAT44(uVar11,1),local_148);
  VVar4 = (*vk->_vptr_DeviceInterface[0x4a])
                    (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  ::vk::checkResult(VVar4,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x1c9);
  submitCommandsAndWait(this_00,vk,device,local_168,(VkCommandBuffer *)cmdBuffer);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  return;
}

Assistant:

void CopiesAndBlittingTestInstance::uploadImageAspect (const tcu::ConstPixelBufferAccess& imageAccess, const VkImage& image, const ImageParms& parms)
{
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const VkDevice				vkDevice			= m_context.getDevice();
	const VkQueue				queue				= m_context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&					memAlloc			= m_context.getDefaultAllocator();
	Move<VkBuffer>				buffer;
	const deUint32				bufferSize			= calculateSize(imageAccess);
	de::MovePtr<Allocation>		bufferAlloc;
	const deUint32				arraySize			= getArraySize(parms);
	const VkExtent3D			imageExtent			= getExtent3D(parms);

	// Create source buffer
	{
		const VkBufferCreateInfo			bufferParams			=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			bufferSize,									// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, vkDevice, &bufferParams);
		bufferAlloc = memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));
	}

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier				preBufferBarrier		=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType	sType;
		DE_NULL,										// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,						// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32			dstQueueFamilyIndex;
		*buffer,										// VkBuffer			buffer;
		0u,												// VkDeviceSize		offset;
		bufferSize										// VkDeviceSize		size;
	};

	const VkImageAspectFlags				formatAspect			= getAspectFlags(mapVkFormat(parms.format));
	const bool								skipPreImageBarrier		= formatAspect == (VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT) &&
																	  getAspectFlags(imageAccess.getFormat()) == VK_IMAGE_ASPECT_STENCIL_BIT;
	const VkImageMemoryBarrier				preImageBarrier			=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		image,											// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			formatAspect,	// VkImageAspectFlags	aspect;
			0u,				// deUint32				baseMipLevel;
			1u,				// deUint32				mipLevels;
			0u,				// deUint32				baseArraySlice;
			arraySize,		// deUint32				arraySize;
		}
	};

	const VkImageMemoryBarrier				postImageBarrier		=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		image,											// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			formatAspect,				// VkImageAspectFlags	aspect;
			0u,							// deUint32				baseMipLevel;
			1u,							// deUint32				mipLevels;
			0u,							// deUint32				baseArraySlice;
			arraySize,					// deUint32				arraySize;
		}
	};

	const VkBufferImageCopy		copyRegion		=
	{
		0u,												// VkDeviceSize				bufferOffset;
		(deUint32)imageAccess.getWidth(),				// deUint32					bufferRowLength;
		(deUint32)imageAccess.getHeight(),				// deUint32					bufferImageHeight;
		{
			getAspectFlags(imageAccess.getFormat()),		// VkImageAspectFlags	aspect;
			0u,												// deUint32				mipLevel;
			0u,												// deUint32				baseArrayLayer;
			arraySize,										// deUint32				layerCount;
		},												// VkImageSubresourceLayers	imageSubresource;
		{ 0, 0, 0 },									// VkOffset3D				imageOffset;
		imageExtent										// VkExtent3D				imageExtent;
	};

	// Write buffer data
	deMemcpy(bufferAlloc->getHostPtr(), imageAccess.getDataPtr(), bufferSize);
	flushMappedMemoryRange(vk, vkDevice, bufferAlloc->getMemory(), bufferAlloc->getOffset(), bufferSize);

	// Copy buffer to image
	const VkCommandBufferBeginInfo			cmdBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,			// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL,
						  1, &preBufferBarrier, (skipPreImageBarrier ? 0 : 1), (skipPreImageBarrier ? DE_NULL : &preImageBarrier));
	vk.cmdCopyBufferToImage(*m_cmdBuffer, *buffer, image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &copyRegion);
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));

	submitCommandsAndWait(vk, vkDevice, queue, *m_cmdBuffer);
}